

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  timeval newer;
  char line [257];
  char format [40];
  
  newer = tvnow();
  lVar10 = dltotal + ultotal;
  lVar11 = *(long *)((long)clientp + 0x30) + lVar10;
  lVar9 = dlnow + ulnow;
  lVar12 = *(long *)((long)clientp + 0x30) + lVar9;
  if (*clientp != 0) {
    if (lVar11 == 0) {
      lVar6 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
      if (lVar6 < 100) {
        return 0;
      }
      lVar6 = *(long *)((long)clientp + 8);
      iVar4 = *(int *)((long)clientp + 0x20);
      iVar5 = 0;
      curl_msnprintf(line,0x100,"%*s\r",iVar4 + -1," ");
      builtin_strncpy(line + *(int *)((long)clientp + 0x3c),"-=O=-",5);
      uVar1 = *(uint *)((long)clientp + 0x38);
      uVar8 = 10000 / (long)(iVar4 + -2) & 0xffffffff;
      line[(int)(sinus[(ulong)uVar1 % 200] / uVar8)] = '#';
      line[(int)(sinus[(ulong)(uVar1 + 5) % 200] / uVar8)] = '#';
      line[(int)(sinus[(ulong)(uVar1 + 10) % 200] / uVar8)] = '#';
      line[(int)(sinus[(ulong)(uVar1 + 0xf) % 200] / uVar8)] = '#';
      fputs(line,*(FILE **)((long)clientp + 0x28));
      uVar1 = *(int *)((long)clientp + 0x38) + 2;
      uVar3 = *(int *)((long)clientp + 0x38) - 0xc6;
      if (uVar1 < 200) {
        uVar3 = uVar1;
      }
      *(uint *)((long)clientp + 0x38) = uVar3;
      if (lVar12 != lVar6) {
        iVar5 = *(int *)((long)clientp + 0x40);
      }
      iVar5 = iVar5 + *(int *)((long)clientp + 0x3c);
      *(int *)((long)clientp + 0x3c) = iVar5;
      iVar4 = *(int *)((long)clientp + 0x20) + -6;
      if (iVar5 < iVar4) {
        if (-1 < iVar5) goto LAB_0010c1e1;
        iVar4 = 0;
        uVar2 = 1;
      }
      else {
        uVar2 = 0xffffffff;
      }
      *(undefined4 *)((long)clientp + 0x40) = uVar2;
      *(int *)((long)clientp + 0x3c) = iVar4;
    }
    else {
      if (*(long *)((long)clientp + 8) == lVar12) {
        return 0;
      }
      lVar6 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
      if (lVar6 < 100 && lVar9 < lVar10) {
        return 0;
      }
    }
  }
LAB_0010c1e1:
  *(int *)clientp = *clientp + 1;
  if ((0 < lVar11) && (lVar12 != *(long *)((long)clientp + 8))) {
    if (lVar10 < lVar9) {
      lVar11 = lVar12;
    }
    iVar7 = *(int *)((long)clientp + 0x20) + -7;
    iVar5 = (int)((double)iVar7 * ((double)lVar12 / (double)lVar11));
    iVar4 = 0x100;
    if (iVar5 < 0x100) {
      iVar4 = iVar5;
    }
    memset(line,0x23,(long)iVar4);
    line[iVar4] = '\0';
    curl_msnprintf(format,0x28,"\r%%-%ds %%5.1f%%%%",iVar7);
    curl_mfprintf(((double)lVar12 / (double)lVar11) * 100.0,*(undefined8 *)((long)clientp + 0x28),
                  format,line);
  }
  fflush(*(FILE **)((long)clientp + 0x28));
  *(long *)((long)clientp + 8) = lVar12;
  *(timeval *)((long)clientp + 0x10) = newer;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH + 1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  struct timeval now = tvnow();
  struct ProgressData *bar = (struct ProgressData *)clientp;
  curl_off_t total;
  curl_off_t point;

  /* expected transfer size */
  total = dltotal + ultotal + bar->initial_size;

  /* we've come this far */
  point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  return 0;
}